

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  size_t sVar6;
  cmInstallFilesGenerator *g;
  cmGlobalGenerator *this_00;
  char *pcVar7;
  string *psVar8;
  pointer pbVar9;
  cmInstallCommandArguments *pcVar10;
  undefined1 auVar11 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  cmCAStringVector files;
  ostringstream e;
  cmInstallCommandArguments ica;
  string local_690;
  undefined4 local_670;
  MessageType local_66c;
  uint local_668;
  int local_664;
  undefined8 local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  cmGlobalGenerator *local_640;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  cmCAStringVector local_618;
  undefined1 local_5a0 [376];
  cmInstallCommandArguments local_428;
  
  iVar3 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_428,&this->DefaultComponentName);
  pcVar7 = "FILES";
  if (iVar3 == 0) {
    pcVar7 = "PROGRAMS";
  }
  local_664 = iVar3;
  cmCAStringVector::cmCAStringVector
            (&local_618,&local_428.Parser,pcVar7,(cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows(&local_618.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&local_428.ArgumentGroup,&local_618.super_cmCommandArgument);
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar10 = &local_428;
  cmCommandArgumentsHelper::Parse(&pcVar10->Parser,args,&local_658);
  if (local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5a0,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," given unknown argument \"",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,((local_658.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_658.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_690);
LAB_002fe635:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
    bVar2 = false;
    goto LAB_002fe673;
  }
  if (local_618.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_618.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
    goto LAB_002fe673;
  }
  psVar8 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
  do {
    if ((pcVar10->Rename).String._M_string_length != 0) {
      psVar8 = &(pcVar10->Rename).String;
      break;
    }
    pcVar10 = pcVar10->GenericArguments;
  } while (pcVar10 != (cmInstallCommandArguments *)0x0);
  if ((0x20 < (ulong)((long)local_618.Vector.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_618.Vector.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) &&
     (psVar8->_M_string_length != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5a0,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," given RENAME option with more than one file.",0x2d);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_690);
    goto LAB_002fe635;
  }
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = MakeFilesFullPath(this,(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            &local_618.Vector,&local_638);
  if (bVar2) {
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062);
    local_660 = CONCAT44(extraout_var,PVar4);
    local_640 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    if (local_618.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_618.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_668 = (int)local_660 - 2;
      pbVar9 = local_618.Vector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar2 = cmGlobalGenerator::IsExportedTargetsFile(local_640,pbVar9);
        if (bVar2) {
          auVar11 = std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
          if (local_668 < 3) {
            local_66c = FATAL_ERROR;
            local_670 = (undefined4)CONCAT71(auVar11._1_7_,1);
            pcVar7 = "may";
LAB_002fe8b9:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5a0,"The file\n  ",0xb);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_5a0,(pbVar9->_M_dataplus)._M_p,
                                pbVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\nwas generated by the export() command.  It ",0x2c);
            sVar6 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,sVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,
                       " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                       ,0x86);
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,local_66c,&local_690,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_690._M_dataplus._M_p != &local_690.field_2) {
              operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1
                             );
            }
            if ((char)local_670 != '\0') goto LAB_002feac2;
          }
          else if ((int)local_660 == 1) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_690,(cmPolicies *)0x3e,auVar11._8_4_);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_5a0,local_690._M_dataplus._M_p,
                                local_690._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_690._M_dataplus._M_p != &local_690.field_2) {
              operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1
                             );
            }
            local_670 = 0;
            pcVar7 = "should";
            local_66c = AUTHOR_WARNING;
            goto LAB_002fe8b9;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
          std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_618.Vector.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar10 = &local_428;
    bVar2 = cmInstallCommandArguments::Finalize(pcVar10);
    if (!bVar2) goto LAB_002feae3;
    psVar8 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
    do {
      if ((pcVar10->DestinationString)._M_string_length != 0) {
        psVar8 = &pcVar10->DestinationString;
        break;
      }
      pcVar10 = pcVar10->GenericArguments;
    } while (pcVar10 != (cmInstallCommandArguments *)0x0);
    if (psVar8->_M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5a0,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," given no DESTINATION!",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_690);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
      }
LAB_002feac2:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
      goto LAB_002feae3;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    g = CreateInstallFilesGenerator(pcVar1,&local_638,&local_428,local_664 == 0);
    cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_428);
    bVar2 = true;
    cmGlobalGenerator::AddInstallComponent(this_00,(psVar8->_M_dataplus)._M_p);
  }
  else {
LAB_002feae3:
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638);
LAB_002fe673:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658);
  local_618.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAStringVector_005c6810;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_618.Vector);
  local_618.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005c67e0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_618.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_428);
  return bVar2;
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(0);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if(!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if(filesVector.empty())
    {
    return true;
    }

  if(!ica.GetRename().empty() && filesVector.size() > 1)
    {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
    }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles))
    {
    return false;
    }

  cmPolicies::PolicyStatus status =
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  for(std::vector<std::string>::const_iterator fileIt = filesVector.begin();
      fileIt != filesVector.end(); ++fileIt)
    {
    if (gg->IsExportedTargetsFile(*fileIt))
      {
      const char *modal = 0;
      std::ostringstream e;
      cmake::MessageType messageType = cmake::AUTHOR_WARNING;

      switch(status)
        {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = cmake::FATAL_ERROR;
        }
      if (modal)
        {
        e << "The file\n  " << *fileIt << "\nwas generated by the export() "
          "command.  It " << modal << " not be installed with the "
          "install() command.  Use the install(EXPORT) mechanism "
          "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
      }
    }

  if (!ica.Finalize())
    {
    return false;
    }

  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(
    CreateInstallFilesGenerator(this->Makefile, absFiles, ica, programs));

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(ica.GetComponent().c_str());

  return true;
}